

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstitutionTree.hpp
# Opt level: O0

void __thiscall
Indexing::SubstitutionTree<Inferences::ALASCA::BinaryResolutionConf::Lhs>::GenMatcher::
GenMatcher<Kernel::Literal*>(GenMatcher *this,Literal *query,uint nextSpecVar)

{
  Stack<unsigned_int> *in_RDI;
  Stack<unsigned_int> *this_00;
  uint nextSpecVar_00;
  Literal *query_00;
  GenMatcher *this_01;
  
  query_00 = (Literal *)0x0;
  this_00 = in_RDI;
  Lib::Stack<unsigned_int>::Stack(in_RDI,(size_t)in_RDI);
  this_01 = (GenMatcher *)(this_00 + 1);
  Lib::DArray<Kernel::TermList>::DArray((DArray<Kernel::TermList> *)this_00,(size_t)in_RDI);
  nextSpecVar_00 = (uint)((ulong)this_00 >> 0x20);
  Lib::ArrayMap<Kernel::TermList>::ArrayMap((ArrayMap<Kernel::TermList> *)(in_RDI + 2));
  init<Kernel::Literal*>(this_01,query_00,nextSpecVar_00);
  return;
}

Assistant:

GenMatcher(TermOrLit query, unsigned nextSpecVar)
      { init(query,nextSpecVar); }